

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes ReadBitVector(CSzData *sd,UInt32 numItems,Byte **v,ISzAlloc *alloc)

{
  Byte *pBVar1;
  sbyte sVar2;
  ulong uVar3;
  ulong __n;
  
  *v = (Byte *)0x0;
  if (sd->Size == 0) {
    return 0x10;
  }
  uVar3 = sd->Size - 1;
  sd->Size = uVar3;
  pBVar1 = sd->Data;
  sd->Data = pBVar1 + 1;
  if (7 < numItems + 7) {
    __n = (ulong)(numItems + 7 >> 3);
    if (*pBVar1 == '\0') {
      if (uVar3 < __n) {
        return 0x10;
      }
      pBVar1 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,__n);
      *v = pBVar1;
      if (pBVar1 == (Byte *)0x0) {
        return 2;
      }
      memcpy(pBVar1,sd->Data,__n);
      sd->Size = sd->Size - __n;
      sd->Data = sd->Data + __n;
    }
    else {
      pBVar1 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,__n);
      *v = pBVar1;
      if (pBVar1 == (Byte *)0x0) {
        return 2;
      }
      memset(pBVar1,0xff,__n);
      if ((numItems & 7) != 0) {
        sVar2 = (sbyte)(numItems & 7);
        pBVar1[__n - 1] = (Byte)(~(-1 << sVar2) << (8U - sVar2 & 0x1f));
      }
    }
  }
  return 0;
}

Assistant:

static MY_NO_INLINE SRes ReadBitVector(CSzData *sd, UInt32 numItems, Byte **v, ISzAlloc *alloc)
{
  Byte allAreDefined;
  Byte *v2;
  UInt32 numBytes = (numItems + 7) >> 3;
  *v = NULL;
  SZ_READ_BYTE(allAreDefined);
  if (numBytes == 0)
    return SZ_OK;
  if (allAreDefined == 0)
  {
    if (numBytes > sd->Size)
      return SZ_ERROR_ARCHIVE;
    MY_ALLOC_AND_CPY(*v, numBytes, sd->Data, alloc);
    SKIP_DATA(sd, numBytes);
    return SZ_OK;
  }
  MY_ALLOC(Byte, *v, numBytes, alloc);
  v2 = *v;
  memset(v2, 0xFF, (size_t)numBytes);
  {
    unsigned numBits = (unsigned)numItems & 7;
    if (numBits != 0)
      v2[numBytes - 1] = (Byte)((((UInt32)1 << numBits) - 1) << (8 - numBits));
  }
  return SZ_OK;
}